

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

string * units::to_string_abi_cxx11_(precise_unit *un,uint64_t match_flags)

{
  precise_unit *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  uint32_t in_stack_00000164;
  string *in_stack_00000168;
  uint64_t in_stack_000017d8;
  precise_unit in_stack_000017e0;
  
  to_string_internal_abi_cxx11_(in_stack_000017e0,in_stack_000017d8);
  precise_unit::commodity(in_RSI);
  clean_unit_string(in_stack_00000168,in_stack_00000164);
  std::__cxx11::string::~string(in_RDI);
  return in_RDI;
}

Assistant:

std::string to_string(const precise_unit& un, std::uint64_t match_flags)
{
    return clean_unit_string(
        to_string_internal(un, match_flags), un.commodity());
}